

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> * __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Copy
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this)

{
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *pHVar1;
  DictionaryStats *pDVar2;
  ulong uVar3;
  long lVar4;
  
  pHVar1 = New(this->alloc,this->tableSize);
  if (this->tableSize != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
      CopyTo<&Bucket<ObjTypeGuardBucket>::Copy>
                ((SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)&(this->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4),
                 this->alloc,
                 (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)&(pHVar1->table->super_SListNodeBase<Memory::ArenaAllocator>).next + lVar4))
      ;
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < this->tableSize);
  }
  if (this->stats != (DictionaryStats *)0x0) {
    pDVar2 = DictionaryStats::Clone(this->stats);
    pHVar1->stats = pDVar2;
  }
  return pHVar1;
}

Assistant:

HashTable<T> *Copy()
    {
        HashTable<T> *newTable = HashTable<T>::New(this->alloc, this->tableSize);

        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].template CopyTo<Bucket<T>::Copy>(this->alloc, newTable->table[i]);
        }
#if PROFILE_DICTIONARY
        if (stats)
            newTable->stats = stats->Clone();
#endif
        return newTable;
    }